

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::JavascriptArray::SetLastUsedSegment(JavascriptArray *this,SparseArraySegmentBase *segment)

{
  bool bVar1;
  Type *this_00;
  
  bVar1 = HasSegmentMap(this);
  this_00 = (Type *)((long)this->segmentUnion + 0x20);
  if (!bVar1) {
    this_00 = &this->segmentUnion;
  }
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet
            (&this_00->lastUsedSegment,segment);
  return;
}

Assistant:

void JavascriptArray::SetLastUsedSegment(SparseArraySegmentBase * segment)
    {
        if (HasSegmentMap())
        {
            this->segmentUnion.segmentBTreeRoot->lastUsedSegment = segment;
        }
        else
        {
            this->segmentUnion.lastUsedSegment = segment;
        }
    }